

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O2

Flags __thiscall absl::lts_20250127::str_format_internal::ConvTag::as_flags(ConvTag *this)

{
  Flags FVar1;
  uint __line;
  char *__assertion;
  
  FVar1 = this->tag_;
  if ((char)FVar1 < '\0') {
    if ((FVar1 & ~(kZero|kAlt|kSignCol|kShowPos|kLeft)) ==
        ~(kNonBasic|kZero|kAlt|kSignCol|kShowPos|kLeft)) {
      return FVar1 & (kZero|kAlt|kSignCol|kShowPos|kLeft);
    }
    __assertion = "is_flags()";
    __line = 0x71;
  }
  else {
    __assertion = "!is_conv()";
    __line = 0x6f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                ,__line,"Flags absl::str_format_internal::ConvTag::as_flags() const");
}

Assistant:

constexpr Flags as_flags() const {
    assert(!is_conv());
    assert(!is_length());
    assert(is_flags());
    return static_cast<Flags>(tag_ & 0x1F);
  }